

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

int helics::getPropertyIndex(string *val)

{
  int iVar1;
  __const_iterator __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  __const_iterator in_RDI;
  int res;
  value_type *fnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  _Alloc_hider in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff68;
  char local_40 [36];
  int local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  int local_4;
  
  __first._M_current =
       (char *)frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::__cxx11::string>
                         (in_stack_ffffffffffffff20._M_current,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__first._M_current
  ;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           frozen::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x346284);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__first._M_current ==
      pbVar2) {
    gmlc::utilities::makeLowerCase
              ((string *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::find<std::__cxx11::string>
                     ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)in_stack_ffffffffffffff20._M_current,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             frozen::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)0x3462e4);
    if (this == pbVar3) {
      __first_00._M_current = local_40;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff50._M_p,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __first._M_current);
      iVar1 = getFlagIndex((string *)in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(in_stack_ffffffffffffff10);
      local_4 = iVar1;
      if (iVar1 < 0) {
        local_1c = iVar1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  (in_stack_ffffffffffffff08);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (__first_00,in_stack_ffffffffffffff20,
                   (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff10,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff08);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff10,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff08);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (this,__first,in_RDI);
        pvVar4 = frozen::
                 unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,69ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                 ::find<std::__cxx11::string>
                           ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)in_stack_ffffffffffffff20._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar4;
        pvVar5 = frozen::
                 unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_69UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)0x34645c);
        if (pvVar4 == pvVar5) {
          pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff50;
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff50._M_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __first._M_current);
          local_4 = getFlagIndex((string *)in_stack_ffffffffffffff68);
          std::__cxx11::string::~string(pbVar2);
        }
        else {
          local_4 = *(int *)&local_18->field_2;
        }
      }
    }
    else {
      local_4 = *(int *)&local_18->field_2;
    }
  }
  else {
    local_4 = *(int *)&local_18->field_2;
  }
  return local_4;
}

Assistant:

int getPropertyIndex(std::string val)
{
    const auto* fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    gmlc::utilities::makeLowerCase(val);
    fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    auto res = getFlagIndex(val);
    if (res >= 0) {
        return res;
    }
    val.erase(std::remove(val.begin(), val.end(), '_'), val.end());
    fnd = propStringsTranslations.find(val);
    if (fnd != propStringsTranslations.end()) {
        return fnd->second;
    }
    return getFlagIndex(val);
}